

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  short sVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  undefined1 uVar8;
  uint uVar9;
  undefined8 in_RCX;
  byte bVar10;
  float fVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  byte bVar18;
  byte bVar19;
  float fVar20;
  ImGuiWindow *pIVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pIVar6 = GImGui;
  pIVar23 = GImGui->MovingWindow;
  pIVar22 = (ImGuiWindow *)0x0;
  if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x200) == 0)) {
    pIVar22 = pIVar23;
  }
  IVar3 = (GImGui->Style).TouchExtraPadding;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = IVar3.x;
  auVar25._4_4_ = IVar3.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar26._8_4_ = 0x40800000;
    auVar26._0_8_ = 0x4080000040800000;
    auVar26._12_4_ = 0x40800000;
    auVar25 = vmaxps_avx(auVar25,auVar26);
    lVar16 = auVar25._0_8_;
  }
  else {
    lVar16 = ((ulong)(uint)IVar3.y << 0x20) + CONCAT44((int)((ulong)in_RCX >> 0x20),IVar3.x);
  }
  lVar12 = (long)(GImGui->Windows).Size;
  if (lVar12 < 1) {
    pIVar7 = (ImGuiWindow *)0x0;
  }
  else {
    uVar13 = lVar12 + 1;
    pIVar7 = (ImGuiWindow *)0x0;
    do {
      pIVar5 = (GImGui->Windows).Data[uVar13 - 2];
      if (((pIVar5->Active == true) && (pIVar5->Hidden == false)) &&
         (uVar9 = pIVar5->Flags, (uVar9 >> 9 & 1) == 0)) {
        fVar11 = IVar3.x;
        if ((uVar9 & 0x1000042) == 0) {
          fVar11 = (float)lVar16;
        }
        fVar1 = (GImGui->IO).MousePos.x;
        if ((pIVar5->OuterRectClipped).Min.x - fVar11 <= fVar1) {
          fVar20 = IVar3.y;
          if ((uVar9 & 0x1000042) == 0) {
            fVar20 = (float)((ulong)lVar16 >> 0x20);
          }
          fVar2 = (GImGui->IO).MousePos.y;
          if (((((pIVar5->OuterRectClipped).Min.y - fVar20 <= fVar2) &&
               (fVar1 < fVar11 + (pIVar5->OuterRectClipped).Max.x)) &&
              (fVar2 < fVar20 + (pIVar5->OuterRectClipped).Max.y)) &&
             (((sVar4 = (pIVar5->HitTestHoleSize).x, sVar4 == 0 ||
               (fVar11 = (float)(int)(pIVar5->HitTestHoleOffset).x + (pIVar5->Pos).x, fVar1 < fVar11
               )) || ((fVar11 + (float)(int)sVar4 <= fVar1 ||
                      ((fVar11 = (float)(int)(pIVar5->HitTestHoleOffset).y + (pIVar5->Pos).y,
                       fVar2 < fVar11 || (fVar11 + (float)(int)(pIVar5->HitTestHoleSize).y <= fVar2)
                       ))))))) {
            if (pIVar22 == (ImGuiWindow *)0x0) {
              pIVar22 = pIVar5;
            }
            pIVar21 = pIVar5;
            if (pIVar7 != (ImGuiWindow *)0x0) {
              pIVar21 = pIVar7;
            }
            if (((pIVar23 == (ImGuiWindow *)0x0) || (pIVar7 != (ImGuiWindow *)0x0)) ||
               (pIVar21 = pIVar5, pIVar5->RootWindow != pIVar23->RootWindow)) {
              pIVar7 = pIVar21;
              if (pIVar22 != (ImGuiWindow *)0x0) {
                GImGui->HoveredWindow = pIVar22;
                goto LAB_0014f3ae;
              }
              pIVar22 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar7 = (ImGuiWindow *)0x0;
            }
          }
        }
      }
      uVar13 = uVar13 - 1;
    } while (1 < uVar13);
  }
  GImGui->HoveredWindow = pIVar22;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    pIVar22 = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
LAB_0014f3ae:
    pIVar23 = pIVar22->RootWindow;
  }
  pIVar6->HoveredRootWindow = pIVar23;
  pIVar6->HoveredWindowUnderMovingWindow = pIVar7;
  pIVar7 = GetTopMostPopupModal();
  bVar24 = false;
  if ((pIVar7 != (ImGuiWindow *)0x0) && (bVar24 = false, pIVar23 != (ImGuiWindow *)0x0)) {
    if (pIVar23->RootWindow == pIVar7) {
      bVar24 = false;
    }
    else {
      do {
        bVar24 = pIVar23 != pIVar7;
        if (pIVar23 == pIVar7) break;
        pIVar23 = pIVar23->ParentWindow;
      } while (pIVar23 != (ImGuiWindow *)0x0);
    }
  }
  uVar9 = (pIVar6->IO).ConfigFlags;
  iVar15 = -1;
  lVar16 = 0;
  bVar10 = 0;
  do {
    if ((pIVar6->IO).MouseClicked[lVar16] == true) {
      bVar17 = true;
      if (pIVar22 == (ImGuiWindow *)0x0) {
        bVar17 = 0 < (pIVar6->OpenPopupStack).Size;
      }
      (pIVar6->IO).MouseDownOwned[lVar16] = bVar17;
    }
    bVar17 = (pIVar6->IO).MouseDown[lVar16];
    if ((bVar17 == true) &&
       ((iVar15 == -1 ||
        ((pIVar6->IO).MouseClickedTime[lVar16] < (pIVar6->IO).MouseClickedTime[iVar15])))) {
      iVar15 = (int)lVar16;
    }
    bVar10 = bVar10 & 1 | bVar17;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 5);
  bVar19 = 1;
  bVar14 = 1;
  if (iVar15 != -1) {
    bVar14 = (pIVar6->IO).MouseDownOwned[iVar15];
  }
  bVar18 = (byte)((uVar9 & 0x10) >> 4) | bVar24;
  if (pIVar6->DragDropActive == true) {
    bVar19 = (pIVar6->DragDropSourceFlags & 0x10U) == 0 | bVar18;
  }
  if (bVar14 != 0) {
    bVar19 = bVar18;
  }
  if (bVar19 != 0) {
    pIVar6->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  if (pIVar6->WantCaptureMouseNextFrame == -1) {
    bVar24 = true;
    if ((bVar14 & (pIVar22 != (ImGuiWindow *)0x0 || bVar10 != 0)) == 0) {
      bVar24 = 0 < (pIVar6->OpenPopupStack).Size;
    }
    (pIVar6->IO).WantCaptureMouse = bVar24;
  }
  else {
    (pIVar6->IO).WantCaptureMouse = pIVar6->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar6->WantCaptureKeyboardNextFrame == -1) {
    bVar24 = pIVar6->ActiveId != 0 || pIVar7 != (ImGuiWindow *)0x0;
  }
  else {
    bVar24 = pIVar6->WantCaptureKeyboardNextFrame != 0;
  }
  uVar9 = uVar9 & 9;
  uVar8 = (char)uVar9;
  if (uVar9 != 1) {
    uVar8 = bVar24;
  }
  if ((pIVar6->IO).NavActive == false) {
    uVar8 = bVar24;
  }
  (pIVar6->IO).WantCaptureKeyboard = (bool)uVar8;
  (pIVar6->IO).WantTextInput = pIVar6->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}